

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_gost2015.c
# Opt level: O1

int gost2015_set_asn1_params(ASN1_TYPE *params,uchar *iv,size_t iv_size,uchar *kdf_seed)

{
  byte bVar1;
  int iVar2;
  GOST2015_CIPHER_PARAMS *a;
  ASN1_OCTET_STRING *str;
  int iVar3;
  uchar *buf;
  uchar ukm_buf [16];
  uchar *local_50;
  undefined8 local_48 [3];
  
  a = GOST2015_CIPHER_PARAMS_new();
  local_50 = (uchar *)0x0;
  if (a == (GOST2015_CIPHER_PARAMS *)0x0) {
    ERR_GOST_error(0x9f,0xc0100,
                   "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_gost2015.c"
                   ,0x65);
    return 0;
  }
  memcpy(local_48,iv,iv_size);
  *(undefined8 *)((long)local_48 + iv_size) = *(undefined8 *)kdf_seed;
  iVar2 = ASN1_STRING_set((ASN1_STRING *)a->ukm,local_48,(int)iv_size + 8);
  if (iVar2 == 0) {
    ERR_GOST_error(0x9f,0xc0100,
                   "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_gost2015.c"
                   ,0x6d);
  }
  else {
    iVar2 = i2d_GOST2015_CIPHER_PARAMS(a,&local_50);
    bVar1 = 1;
    if (0 < iVar2) {
      str = ASN1_OCTET_STRING_new();
      iVar3 = 0;
      if (str != (ASN1_OCTET_STRING *)0x0) {
        iVar2 = ASN1_OCTET_STRING_set(str,local_50,iVar2);
        if (iVar2 != 0) {
          ASN1_TYPE_set((ASN1_TYPE *)params,0x10,str);
          iVar3 = 1;
          bVar1 = 0;
        }
        goto LAB_00115cf1;
      }
    }
  }
  iVar3 = 0;
  bVar1 = 1;
  str = (ASN1_OCTET_STRING *)0x0;
LAB_00115cf1:
  CRYPTO_free(local_50);
  if (!(bool)(bVar1 ^ 1 | str == (ASN1_OCTET_STRING *)0x0)) {
    ASN1_OCTET_STRING_free(str);
  }
  GOST2015_CIPHER_PARAMS_free(a);
  return iVar3;
}

Assistant:

int gost2015_set_asn1_params(ASN1_TYPE *params,
    const unsigned char *iv, size_t iv_size, const unsigned char *kdf_seed)
{
    GOST2015_CIPHER_PARAMS *gcp = GOST2015_CIPHER_PARAMS_new();
    int ret = 0, len = 0;

    ASN1_OCTET_STRING *os = NULL;
    unsigned char ukm_buf[MAX_GOST2015_UKM_SIZE];
    unsigned char *buf = NULL;

    if (gcp == NULL) {
        GOSTerr(GOST_F_GOST2015_SET_ASN1_PARAMS, ERR_R_MALLOC_FAILURE);
        return 0;
    }

    memcpy(ukm_buf, iv, iv_size);
    memcpy(ukm_buf+iv_size, kdf_seed, KDF_SEED_SIZE);

    if (ASN1_STRING_set(gcp->ukm, ukm_buf, iv_size + KDF_SEED_SIZE) == 0) {
        GOSTerr(GOST_F_GOST2015_SET_ASN1_PARAMS, ERR_R_MALLOC_FAILURE);
        goto end;
    }

    len = i2d_GOST2015_CIPHER_PARAMS(gcp, &buf);

    if (len <= 0
       || (os = ASN1_OCTET_STRING_new()) == NULL
       || ASN1_OCTET_STRING_set(os, buf, len) == 0) {
        goto end;
  }

    ASN1_TYPE_set(params, V_ASN1_SEQUENCE, os);
    ret = 1;

end:
    OPENSSL_free(buf);
    if (ret <= 0 && os)
        ASN1_OCTET_STRING_free(os);

    GOST2015_CIPHER_PARAMS_free(gcp);
    return ret;
}